

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::ReflectionOps::Merge(Message *from,Message *to)

{
  FieldDescriptor *pFVar1;
  pointer ppFVar2;
  Message *pMVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  CppType CVar7;
  Descriptor *pDVar8;
  LogMessage *pLVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar11;
  size_type sVar12;
  reference ppFVar13;
  long *plVar14;
  undefined8 uVar15;
  UnknownFieldSet *this;
  UnknownFieldSet *other;
  undefined4 uVar16;
  string local_130 [32];
  string local_110 [32];
  int local_f0;
  int local_ec;
  int j;
  int count;
  FieldDescriptor *field;
  undefined1 local_d8 [4];
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *to_reflection;
  Reflection *from_reflection;
  LogMessage local_a8;
  Descriptor *local_70;
  Descriptor *descriptor;
  byte local_51;
  LogMessage local_50;
  Message *local_18;
  Message *to_local;
  Message *from_local;
  long *plVar10;
  
  local_51 = 0;
  local_18 = to;
  to_local = from;
  if (from == to) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x37);
    local_51 = 1;
    pLVar9 = LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (to): ");
    LogFinisher::operator=((LogFinisher *)((long)&descriptor + 3),pLVar9);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  local_70 = Message::GetDescriptor(to_local);
  pDVar8 = Message::GetDescriptor(local_18);
  from_reflection._7_1_ = 0;
  if (pDVar8 != local_70) {
    LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x3a);
    from_reflection._7_1_ = 1;
    pLVar9 = LogMessage::operator<<
                       (&local_a8,"CHECK failed: (to->GetDescriptor()) == (descriptor): ");
    pLVar9 = LogMessage::operator<<(pLVar9,"Tried to merge messages of different types.");
    LogFinisher::operator=((LogFinisher *)((long)&from_reflection + 6),pLVar9);
  }
  if ((from_reflection._7_1_ & 1) != 0) {
    LogMessage::~LogMessage(&local_a8);
  }
  iVar6 = (*(to_local->super_MessageLite)._vptr_MessageLite[0x12])();
  plVar10 = (long *)CONCAT44(extraout_var,iVar6);
  iVar6 = (*(local_18->super_MessageLite)._vptr_MessageLite[0x12])();
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_00,iVar6);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_d8);
  (**(code **)(*plVar10 + 0x60))
            (plVar10,to_local,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_d8);
  for (field._4_4_ = 0; uVar11 = (ulong)field._4_4_,
      sVar12 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)local_d8), uVar11 < sVar12; field._4_4_ = field._4_4_ + 1) {
    ppFVar13 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             *)local_d8,(long)field._4_4_);
    _j = *ppFVar13;
    bVar4 = FieldDescriptor::is_repeated(_j);
    if (bVar4) {
      local_ec = (**(code **)(*plVar10 + 0x30))(plVar10,to_local,_j);
      for (local_f0 = 0; local_f0 < local_ec; local_f0 = local_f0 + 1) {
        CVar7 = FieldDescriptor::cpp_type(_j);
        pMVar3 = local_18;
        ppFVar2 = fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pFVar1 = _j;
        switch(CVar7) {
        case CPPTYPE_INT32:
          uVar16 = (**(code **)(*plVar10 + 0x118))(plVar10,to_local,_j,local_f0);
          (**(code **)(*ppFVar2 + 0x1c0))(ppFVar2,pMVar3,pFVar1,uVar16);
          break;
        case CPPTYPE_INT64:
          uVar15 = (**(code **)(*plVar10 + 0x120))(plVar10,to_local,_j,local_f0);
          (**(code **)(*ppFVar2 + 0x1c8))(ppFVar2,pMVar3,pFVar1,uVar15);
          break;
        case CPPTYPE_UINT32:
          uVar16 = (**(code **)(*plVar10 + 0x128))(plVar10,to_local,_j,local_f0);
          (**(code **)(*ppFVar2 + 0x1d0))(ppFVar2,pMVar3,pFVar1,uVar16);
          break;
        case CPPTYPE_UINT64:
          uVar15 = (**(code **)(*plVar10 + 0x130))(plVar10,to_local,_j,local_f0);
          (**(code **)(*ppFVar2 + 0x1d8))(ppFVar2,pMVar3,pFVar1,uVar15);
          break;
        case CPPTYPE_DOUBLE:
          uVar15 = (**(code **)(*plVar10 + 0x140))(plVar10,to_local,_j,local_f0);
          (**(code **)(*ppFVar2 + 0x1e8))(uVar15,ppFVar2,pMVar3,pFVar1);
          break;
        case CPPTYPE_FLOAT:
          uVar16 = (**(code **)(*plVar10 + 0x138))(plVar10,to_local,_j,local_f0);
          (**(code **)(*ppFVar2 + 0x1e0))(uVar16,ppFVar2,pMVar3,pFVar1);
          break;
        case CPPTYPE_BOOL:
          bVar5 = (**(code **)(*plVar10 + 0x148))(plVar10,to_local,_j,local_f0);
          (**(code **)(*ppFVar2 + 0x1f0))(ppFVar2,pMVar3,pFVar1,bVar5 & 1);
          break;
        case CPPTYPE_ENUM:
          uVar15 = (**(code **)(*plVar10 + 0x158))(plVar10,to_local,_j,local_f0);
          (**(code **)(*ppFVar2 + 0x200))(ppFVar2,pMVar3,pFVar1,uVar15);
          break;
        case CPPTYPE_STRING:
          (**(code **)(*plVar10 + 0x150))(local_110,plVar10,to_local,_j,local_f0);
          (**(code **)(*ppFVar2 + 0x1f8))(ppFVar2,pMVar3,pFVar1,local_110);
          std::__cxx11::string::~string(local_110);
          break;
        case CPPTYPE_MESSAGE:
          plVar14 = (long *)(**(code **)(*fields.
                                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x208
                                        ))(fields.
                                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           local_18,_j,0);
          uVar15 = (**(code **)(*plVar10 + 0x160))(plVar10,to_local,_j,local_f0);
          (**(code **)(*plVar14 + 0x70))(plVar14,uVar15);
        }
      }
    }
    else {
      CVar7 = FieldDescriptor::cpp_type(_j);
      pMVar3 = local_18;
      ppFVar2 = fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pFVar1 = _j;
      switch(CVar7) {
      case CPPTYPE_INT32:
        uVar16 = (**(code **)(*plVar10 + 0x68))(plVar10,to_local);
        (**(code **)(*ppFVar2 + 0xc0))(ppFVar2,pMVar3,pFVar1,uVar16);
        break;
      case CPPTYPE_INT64:
        uVar15 = (**(code **)(*plVar10 + 0x70))(plVar10,to_local);
        (**(code **)(*ppFVar2 + 200))(ppFVar2,pMVar3,pFVar1,uVar15);
        break;
      case CPPTYPE_UINT32:
        uVar16 = (**(code **)(*plVar10 + 0x78))(plVar10,to_local);
        (**(code **)(*ppFVar2 + 0xd0))(ppFVar2,pMVar3,pFVar1,uVar16);
        break;
      case CPPTYPE_UINT64:
        uVar15 = (**(code **)(*plVar10 + 0x80))(plVar10,to_local);
        (**(code **)(*ppFVar2 + 0xd8))(ppFVar2,pMVar3,pFVar1,uVar15);
        break;
      case CPPTYPE_DOUBLE:
        uVar15 = (**(code **)(*plVar10 + 0x90))(plVar10,to_local);
        (**(code **)(*ppFVar2 + 0xe8))(uVar15,ppFVar2,pMVar3,pFVar1);
        break;
      case CPPTYPE_FLOAT:
        uVar16 = (**(code **)(*plVar10 + 0x88))(plVar10,to_local);
        (**(code **)(*ppFVar2 + 0xe0))(uVar16,ppFVar2,pMVar3,pFVar1);
        break;
      case CPPTYPE_BOOL:
        bVar5 = (**(code **)(*plVar10 + 0x98))(plVar10,to_local);
        (**(code **)(*ppFVar2 + 0xf0))(ppFVar2,pMVar3,pFVar1,bVar5 & 1);
        break;
      case CPPTYPE_ENUM:
        uVar15 = (**(code **)(*plVar10 + 0xa8))(plVar10,to_local);
        (**(code **)(*ppFVar2 + 0x100))(ppFVar2,pMVar3,pFVar1,uVar15);
        break;
      case CPPTYPE_STRING:
        (**(code **)(*plVar10 + 0xa0))(local_130,plVar10,to_local);
        (**(code **)(*ppFVar2 + 0xf8))(ppFVar2,pMVar3,pFVar1,local_130);
        std::__cxx11::string::~string(local_130);
        break;
      case CPPTYPE_MESSAGE:
        plVar14 = (long *)(**(code **)(*fields.
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x108))
                                    (fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_18,_j,
                                     0);
        uVar15 = (**(code **)(*plVar10 + 0xb0))(plVar10,to_local,_j,0);
        (**(code **)(*plVar14 + 0x70))(plVar14,uVar15);
      }
    }
  }
  this = (UnknownFieldSet *)
         (**(code **)(*fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x18))
                   (fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_18);
  other = (UnknownFieldSet *)(**(code **)(*plVar10 + 0x10))(plVar10,to_local);
  UnknownFieldSet::MergeFrom(this,other);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_d8);
  return;
}

Assistant:

void ReflectionOps::Merge(const Message& from, Message* to) {
  GOOGLE_CHECK_NE(&from, to);

  const Descriptor* descriptor = from.GetDescriptor();
  GOOGLE_CHECK_EQ(to->GetDescriptor(), descriptor)
    << "Tried to merge messages of different types.";

  const Reflection* from_reflection = from.GetReflection();
  const Reflection* to_reflection = to->GetReflection();

  vector<const FieldDescriptor*> fields;
  from_reflection->ListFields(from, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];

    if (field->is_repeated()) {
      int count = from_reflection->FieldSize(from, field);
      for (int j = 0; j < count; j++) {
        switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                     \
          case FieldDescriptor::CPPTYPE_##CPPTYPE:                       \
            to_reflection->Add##METHOD(to, field,                        \
              from_reflection->GetRepeated##METHOD(from, field, j));     \
            break;

          HANDLE_TYPE(INT32 , Int32 );
          HANDLE_TYPE(INT64 , Int64 );
          HANDLE_TYPE(UINT32, UInt32);
          HANDLE_TYPE(UINT64, UInt64);
          HANDLE_TYPE(FLOAT , Float );
          HANDLE_TYPE(DOUBLE, Double);
          HANDLE_TYPE(BOOL  , Bool  );
          HANDLE_TYPE(STRING, String);
          HANDLE_TYPE(ENUM  , Enum  );
#undef HANDLE_TYPE

          case FieldDescriptor::CPPTYPE_MESSAGE:
            to_reflection->AddMessage(to, field)->MergeFrom(
              from_reflection->GetRepeatedMessage(from, field, j));
            break;
        }
      }
    } else {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                        \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                            \
          to_reflection->Set##METHOD(to, field,                             \
            from_reflection->Get##METHOD(from, field));                     \
          break;

        HANDLE_TYPE(INT32 , Int32 );
        HANDLE_TYPE(INT64 , Int64 );
        HANDLE_TYPE(UINT32, UInt32);
        HANDLE_TYPE(UINT64, UInt64);
        HANDLE_TYPE(FLOAT , Float );
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL  , Bool  );
        HANDLE_TYPE(STRING, String);
        HANDLE_TYPE(ENUM  , Enum  );
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_MESSAGE:
          to_reflection->MutableMessage(to, field)->MergeFrom(
            from_reflection->GetMessage(from, field));
          break;
      }
    }
  }

  to_reflection->MutableUnknownFields(to)->MergeFrom(
    from_reflection->GetUnknownFields(from));
}